

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

void __thiscall ON_MeshCache::ClearAllMeshes(ON_MeshCache *this,bool bDeleteMesh)

{
  ON_MeshCacheItem *pOVar1;
  ON_MeshCacheItem *local_28;
  ON_MeshCacheItem *item;
  ON_MeshCacheItem *next;
  bool bDeleteMesh_local;
  ON_MeshCache *this_local;
  
  if (this->m_impl != (ON_MeshCacheItem *)0x0) {
    local_28 = this->m_impl;
    this->m_impl = (ON_MeshCacheItem *)0x0;
    while (local_28 != (ON_MeshCacheItem *)0x0) {
      pOVar1 = local_28->m_next;
      Internal_DeleteItem(this,local_28,bDeleteMesh);
      local_28 = pOVar1;
    }
  }
  return;
}

Assistant:

void ON_MeshCache::ClearAllMeshes(bool bDeleteMesh)
{
  if ( 0 != m_impl )
  {
    ON_MeshCacheItem* next = m_impl;
    m_impl = nullptr;
    for (ON_MeshCacheItem* item = next; nullptr != item; item = next)
    {
      next = item->m_next;
      Internal_DeleteItem(item,bDeleteMesh);
    }
  }
}